

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

_Bool malloc_init_hard(void)

{
  pthread_t pVar1;
  _Bool _Var2;
  int iVar3;
  pthread_t pVar4;
  tsd_t *ptVar5;
  long lVar6;
  uint uVar7;
  percpu_arena_mode_t pVar8;
  malloc_init_t mVar9;
  spin_t spinner;
  char *in_FS_OFFSET;
  uint local_2c;
  
  malloc_mutex_lock((tsdn_t *)0x0,&init_lock);
  pVar1 = malloc_initializer;
  mVar9 = malloc_init_state;
  if ((malloc_init_state == malloc_init_initialized) ||
     (pVar4 = pthread_self(), mVar9 == malloc_init_recursible && pVar1 == pVar4)) {
LAB_0012fef7:
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
    return false;
  }
  if (pVar1 != 0 && pVar1 != pVar4) {
    uVar7 = 0;
    do {
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
      if (uVar7 < 5) {
        for (local_2c = 0; local_2c >> ((byte)uVar7 & 0x1f) == 0; local_2c = local_2c + 1) {
        }
        uVar7 = uVar7 + 1;
      }
      else {
        sched_yield();
      }
      malloc_mutex_lock((tsdn_t *)0x0,&init_lock);
    } while (malloc_init_state != malloc_init_initialized);
    goto LAB_0012fef7;
  }
  if ((mVar9 != malloc_init_a0_initialized) && (_Var2 = malloc_init_hard_a0_locked(), _Var2)) {
    init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
    return true;
  }
  init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
  ptVar5 = malloc_tsd_boot0();
  if (ptVar5 == (tsd_t *)0x0) {
    return true;
  }
  malloc_init_state = malloc_init_recursible;
  lVar6 = sysconf(0x54);
  if (lVar6 == -1) {
    lVar6 = 1;
  }
  ncpus = (uint)lVar6;
  iVar3 = pthread_atfork(jemalloc_prefork,jemalloc_postfork_parent,jemalloc_postfork_child);
  if (iVar3 != 0) {
    malloc_write("<jemalloc>: Error in pthread_atfork()\n");
    if (opt_abort != true) {
      return true;
    }
LAB_0012ff9a:
    abort();
  }
  _Var2 = background_thread_boot0();
  if (_Var2) {
    return true;
  }
  malloc_mutex_lock((tsdn_t *)ptVar5,&init_lock);
  ptVar5->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
       ptVar5->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
  if ((ptVar5->state).repr == '\0') {
    tsd_slow_update(ptVar5);
  }
  if (opt_percpu_arena == percpu_arena_disabled) {
LAB_00130060:
    mVar9 = opt_narenas;
    if ((opt_narenas == 0) && (mVar9 = malloc_init_recursible, 1 < ncpus)) {
      mVar9 = ncpus * 4;
    }
  }
  else {
    iVar3 = sched_getcpu();
    if (iVar3 < 0) {
      opt_percpu_arena = percpu_arena_disabled;
      malloc_printf("<jemalloc>: perCPU arena getcpu() not available. Setting narenas to %u.\n");
      if (opt_abort == true) goto LAB_0012ff9a;
      goto LAB_00130060;
    }
    if (0xffe < ncpus) {
      malloc_printf("<jemalloc>: narenas w/ percpuarena beyond limit (%d)\n");
      if (opt_abort == true) goto LAB_0012ff9a;
      goto LAB_00130162;
    }
    uVar7 = ncpus & 1;
    if (uVar7 != 0 && opt_percpu_arena == per_phycpu_arena_uninit) {
      malloc_printf(
                   "<jemalloc>: invalid configuration -- per physical CPU arena with odd number (%u) of CPUs (no hyper threading?).\n"
                   );
      if (opt_abort != false) goto LAB_0012ff9a;
      uVar7 = ncpus & 1;
    }
    mVar9 = (ncpus >> 1) + uVar7;
    if (opt_percpu_arena != per_phycpu_arena_uninit) {
      mVar9 = ncpus;
    }
    if (ncpus < 2) {
      mVar9 = ncpus;
    }
    if (mVar9 <= opt_narenas) goto LAB_00130060;
  }
  opt_narenas = mVar9;
  narenas_auto = opt_narenas;
  if (0xffe < opt_narenas) {
    narenas_auto = 0xffe;
    malloc_printf("<jemalloc>: Reducing narenas to limit (%d)\n");
  }
  narenas_total.repr = narenas_auto;
  _Var2 = arena_init_huge();
  if (_Var2) {
    LOCK();
    narenas_total.repr = narenas_total.repr + 1;
    UNLOCK();
  }
  manual_arena_base = narenas_total.repr;
  _Var2 = background_thread_boot1((tsdn_t *)ptVar5);
  if (!_Var2) {
    pVar8 = opt_percpu_arena + percpu_arena;
    if (opt_percpu_arena == percpu_arena_disabled) {
      pVar8 = opt_percpu_arena;
    }
    opt_percpu_arena = pVar8;
    _Var2 = malloc_mutex_boot();
    if (!_Var2) {
      malloc_init_state = malloc_init_initialized;
      malloc_slow_flags =
           opt_utrace << 3 | opt_zero << 2 | opt_junk_free * '\x02' | opt_junk_alloc |
           malloc_slow_flags | opt_xmalloc << 4;
      malloc_slow = malloc_slow_flags != 0;
      post_reentrancy(ptVar5);
      init_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&init_lock.field_0 + 0x40));
      malloc_tsd_boot1();
      ptVar5 = *(tsd_t **)in_FS_OFFSET;
      if (*in_FS_OFFSET != '\0') {
        ptVar5 = tsd_fetch_slow(ptVar5,false);
      }
      if (opt_background_thread != true) {
        return false;
      }
      background_thread_ctl_init((tsdn_t *)ptVar5);
      _Var2 = background_thread_create(ptVar5,0);
      if (!_Var2) {
        return false;
      }
      return true;
    }
  }
LAB_00130162:
  malloc_init_hard_cleanup((tsdn_t *)ptVar5,true);
  return true;
}

Assistant:

static bool
malloc_init_hard(void) {
	tsd_t *tsd;

#if defined(_WIN32) && _WIN32_WINNT < 0x0600
	_init_init_lock();
#endif
	malloc_mutex_lock(TSDN_NULL, &init_lock);

#define UNLOCK_RETURN(tsdn, ret, reentrancy)		\
	malloc_init_hard_cleanup(tsdn, reentrancy);	\
	return ret;

	if (!malloc_init_hard_needed()) {
		UNLOCK_RETURN(TSDN_NULL, false, false)
	}

	if (malloc_init_state != malloc_init_a0_initialized &&
	    malloc_init_hard_a0_locked()) {
		UNLOCK_RETURN(TSDN_NULL, true, false)
	}

	malloc_mutex_unlock(TSDN_NULL, &init_lock);
	/* Recursive allocation relies on functional tsd. */
	tsd = malloc_tsd_boot0();
	if (tsd == NULL) {
		return true;
	}
	if (malloc_init_hard_recursible()) {
		return true;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &init_lock);
	/* Set reentrancy level to 1 during init. */
	pre_reentrancy(tsd, NULL);
	/* Initialize narenas before prof_boot2 (for allocation). */
	if (malloc_init_narenas() || background_thread_boot1(tsd_tsdn(tsd))) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	if (config_prof && prof_boot2(tsd)) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}

	malloc_init_percpu();

	if (malloc_init_hard_finish()) {
		UNLOCK_RETURN(tsd_tsdn(tsd), true, true)
	}
	post_reentrancy(tsd);
	malloc_mutex_unlock(tsd_tsdn(tsd), &init_lock);

	witness_assert_lockless(witness_tsd_tsdn(
	    tsd_witness_tsdp_get_unsafe(tsd)));
	malloc_tsd_boot1();
	/* Update TSD after tsd_boot1. */
	tsd = tsd_fetch();
	if (opt_background_thread) {
		assert(have_background_thread);
		/*
		 * Need to finish init & unlock first before creating background
		 * threads (pthread_create depends on malloc).  ctl_init (which
		 * sets isthreaded) needs to be called without holding any lock.
		 */
		background_thread_ctl_init(tsd_tsdn(tsd));
		if (background_thread_create(tsd, 0)) {
			return true;
		}
	}
#undef UNLOCK_RETURN
	return false;
}